

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3MatchinfoCheck(Fts3Table *pTab,char cArg,char **pzErr)

{
  char **pzErr_local;
  char cArg_local;
  Fts3Table *pTab_local;
  
  if ((((cArg == 'p') || (cArg == 'c')) || ((cArg == 'n' && (pTab->bFts4 != '\0')))) ||
     ((((cArg == 'a' && (pTab->bFts4 != '\0')) || ((cArg == 'l' && (pTab->bHasDocsize != '\0')))) ||
      ((((cArg == 's' || (cArg == 'x')) || (cArg == 'y')) || (cArg == 'b')))))) {
    pTab_local._4_4_ = 0;
  }
  else {
    sqlite3Fts3ErrMsg(pzErr,"unrecognized matchinfo request: %c",(ulong)(uint)(int)cArg);
    pTab_local._4_4_ = 1;
  }
  return pTab_local._4_4_;
}

Assistant:

static int fts3MatchinfoCheck(
  Fts3Table *pTab, 
  char cArg,
  char **pzErr
){
  if( (cArg==FTS3_MATCHINFO_NPHRASE)
   || (cArg==FTS3_MATCHINFO_NCOL)
   || (cArg==FTS3_MATCHINFO_NDOC && pTab->bFts4)
   || (cArg==FTS3_MATCHINFO_AVGLENGTH && pTab->bFts4)
   || (cArg==FTS3_MATCHINFO_LENGTH && pTab->bHasDocsize)
   || (cArg==FTS3_MATCHINFO_LCS)
   || (cArg==FTS3_MATCHINFO_HITS)
   || (cArg==FTS3_MATCHINFO_LHITS)
   || (cArg==FTS3_MATCHINFO_LHITS_BM)
  ){
    return SQLITE_OK;
  }
  sqlite3Fts3ErrMsg(pzErr, "unrecognized matchinfo request: %c", cArg);
  return SQLITE_ERROR;
}